

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O2

bool __thiscall xmrig::OclThreads::isEqual(OclThreads *this,OclThreads *other)

{
  pointer pOVar1;
  bool bVar2;
  pointer pOVar3;
  pointer other_00;
  pointer this_00;
  
  this_00 = (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == pOVar1) {
    other_00 = (other->m_data).
               super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
               super__Vector_impl_data._M_start;
    pOVar3 = (other->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (other_00 == pOVar3) {
      return true;
    }
  }
  else {
    other_00 = (other->m_data).
               super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
               super__Vector_impl_data._M_start;
    pOVar3 = (other->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pOVar1 - (long)this_00 == (long)pOVar3 - (long)other_00) {
    while ((this_00 != pOVar1 && (bVar2 = OclThread::isEqual(this_00,other_00), bVar2))) {
      this_00 = this_00 + 1;
      other_00 = other_00 + 1;
    }
    return this_00 == pOVar1;
  }
  return false;
}

Assistant:

bool xmrig::OclThreads::isEqual(const OclThreads &other) const
{
    if (isEmpty() && other.isEmpty()) {
        return true;
    }

    return count() == other.count() && std::equal(m_data.begin(), m_data.end(), other.m_data.begin());
}